

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool aedit_climate(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  int iVar2;
  climate_type *pcVar3;
  char *txt;
  int iVar4;
  long lVar5;
  ulong uVar6;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  string buffer;
  char wcli [4608];
  char hold [4608];
  char *local_26f8;
  undefined8 local_26f0;
  char local_26e8;
  undefined7 uStack_26e7;
  long *local_26d8 [2];
  long local_26c8 [3];
  _func_int **local_26b0;
  char *local_26a8 [3];
  long *local_2690 [2];
  long local_2680 [2];
  buffer<char> local_2670;
  char local_2650 [504];
  long local_2458 [576];
  char local_1258 [4648];
  
  local_26f8 = &local_26e8;
  local_26f0 = 0;
  local_26e8 = '\0';
  pvVar1 = ch->desc->pEdit;
  one_argument(argument,(char *)local_2458);
  iVar2 = aclimate_lookup((char *)local_2458);
  if (iVar2 < 0) {
    local_2670.ptr_ = local_2650;
    local_2670.size_ = 0;
    local_26b0 = (_func_int **)&PTR_grow_00457340;
    local_2670._vptr_buffer = (_func_int **)&PTR_grow_00457340;
    local_2670.capacity_ = 500;
    fmt.size_ = 0x1c;
    fmt.data_ = "{} is not a valid climate.\n\r";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_26d8;
    args.desc_ = 0xc;
    local_26d8[0] = local_2458;
    ::fmt::v9::detail::vformat_to<char>(&local_2670,fmt,args,(locale_ref)0x0);
    local_2690[0] = local_2680;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2690,local_2670.ptr_,local_2670.ptr_ + local_2670.size_);
    if (local_2670.ptr_ != local_2650) {
      operator_delete(local_2670.ptr_,local_2670.capacity_);
    }
    std::__cxx11::string::operator=((string *)&local_26f8,(string *)local_2690);
    if (local_2690[0] != local_2680) {
      operator_delete(local_2690[0],local_2680[0] + 1);
    }
    send_to_char(local_26f8,ch);
    send_to_char("The following climates are available:\n\r",ch);
    pcVar3 = climate_table;
    uVar6 = 0;
    lVar5 = 0;
    do {
      if (pcVar3->name == (char *)0x0) {
        iVar4 = -(int)lVar5;
        goto LAB_003627a9;
      }
      sprintf(local_1258,"%s ");
      if ((int)(uVar6 / 3) * -3 == (int)lVar5) {
        local_2670.size_ = 0;
        local_2670._vptr_buffer = local_26b0;
        local_2670.ptr_ = local_2650;
        local_2670.capacity_ = 500;
        fmt_00.size_ = 4;
        fmt_00.data_ = "{}\n\r";
        args_00.field_1.values_ =
             (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_26a8;
        args_00.desc_ = 0xc;
        local_26a8[0] = local_1258;
        ::fmt::v9::detail::vformat_to<char>(&local_2670,fmt_00,args_00,(locale_ref)0x0);
        local_26d8[0] = local_26c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_26d8,local_2670.ptr_,local_2670.ptr_ + local_2670.size_);
        if (local_2670.ptr_ != local_2650) {
          operator_delete(local_2670.ptr_,local_2670.capacity_);
        }
        std::__cxx11::string::operator=((string *)&local_26f8,(string *)local_26d8);
        if (local_26d8[0] != local_26c8) {
          operator_delete(local_26d8[0],local_26c8[0] + 1);
        }
      }
      send_to_char(local_26f8,ch);
      lVar5 = lVar5 + -1;
      pcVar3 = pcVar3 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (lVar5 != -9);
    iVar4 = 9;
LAB_003627a9:
    if ((uint)(iVar4 * -0x55555555) < 0x55555556) goto LAB_003627cf;
    txt = "\n\r";
  }
  else {
    *(short *)((long)pvVar1 + 0x158) = (short)iVar2;
    txt = "Climate set.\n\r";
  }
  send_to_char(txt,ch);
LAB_003627cf:
  if (local_26f8 != &local_26e8) {
    operator_delete(local_26f8,CONCAT71(uStack_26e7,local_26e8) + 1);
  }
  return -1 < iVar2;
}

Assistant:

bool aedit_climate(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	std::string buffer;
	char wcli[MSL];
	char hold[MSL];
	int icli = 0, climate;

	EDIT_AREA(ch, pArea);

	one_argument(argument, wcli);

	icli = aclimate_lookup(wcli);

	if (icli < 0)
	{
		buffer = fmt::format("{} is not a valid climate.\n\r", wcli);
		send_to_char(buffer.c_str(), ch);
		send_to_char("The following climates are available:\n\r", ch);

		for (climate = 0; climate < Climate::MaxClimate; climate++)
		{
			if (climate_table[climate].name == nullptr)
				break;

			sprintf(hold, "%s ", climate_table[climate].name);

			if (climate % 3 == 0)
				buffer = fmt::format("{}\n\r", hold);

			send_to_char(buffer.c_str(), ch);
		}

		if (climate % 3 != 0)
			send_to_char("\n\r", ch);

		return false;
	}
	else
	{
		pArea->climate = icli;
		send_to_char("Climate set.\n\r", ch);
		return true;
	}
}